

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

void __thiscall despot::POMDPXBelief::Update(POMDPXBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  POMDPX *pPVar1;
  State *pSVar2;
  undefined4 uVar3;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_00;
  bool bVar4;
  int iVar5;
  pointer ppSVar6;
  undefined4 extraout_var;
  log_ostream *plVar7;
  ostream *poVar8;
  pointer ppSVar9;
  undefined4 extraout_var_00;
  pointer ppSVar10;
  DSPOMDP *model;
  pointer ppSVar11;
  long lVar12;
  long lVar13;
  int j;
  int i;
  ulong uVar14;
  double extraout_XMM0_Qa;
  double dVar15;
  double extraout_XMM0_Qa_00;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  State *copy;
  vector<despot::State_*,_std::allocator<despot::State_*>_> updated;
  OBS_TYPE o;
  double reward;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_a0;
  undefined1 local_88 [16];
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_78;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *local_60;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_58;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  History::Add(&(this->super_ParticleBelief).super_Belief.history_,action,obs);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = &(this->super_ParticleBelief).particles_;
  ppSVar6 = (pointer)0x0;
  ppSVar10 = (pointer)0x0;
  iVar5 = 0;
  while (iVar5 < this->max_iter_) {
    local_88._0_4_ = iVar5;
    ppSVar9 = (this->super_ParticleBelief).particles_.
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar11 = (this->super_ParticleBelief).particles_.
               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar14 = 0;
    do {
      lVar12 = (long)ppSVar11 - (long)ppSVar9;
      if ((ulong)(lVar12 >> 3) <= uVar14) {
        lVar13 = (long)ppSVar10 - (long)ppSVar6;
        break;
      }
      iVar5 = (*(this->model_->super_MDP)._vptr_MDP[0x1a])(this->model_,ppSVar9[uVar14]);
      pPVar1 = this->model_;
      local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar5);
      Random::NextDouble((Random *)&Random::RANDOM);
      iVar5 = (*(pPVar1->super_MDP)._vptr_MDP[8])
                        (pPVar1,(State *)CONCAT44(extraout_var,iVar5),action,local_38,local_40);
      (*(this->model_->super_MDP)._vptr_MDP[0xc])
                (this->model_,obs,local_a0._M_impl.super__Vector_impl_data._M_start,action);
      if ((char)iVar5 == '\0' && extraout_XMM0_Qa != 0.0) {
        *(double *)((long)local_a0._M_impl.super__Vector_impl_data._M_start + 0x18) =
             extraout_XMM0_Qa *
             *(double *)((long)local_a0._M_impl.super__Vector_impl_data._M_start + 0x18);
        std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                  ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_78,
                   (value_type *)&local_a0);
      }
      else {
        (*(this->model_->super_MDP)._vptr_MDP[0x1b])
                  (this->model_,local_a0._M_impl.super__Vector_impl_data._M_start);
      }
      lVar13 = (long)local_78._M_impl.super__Vector_impl_data._M_finish -
               (long)local_78._M_impl.super__Vector_impl_data._M_start;
      ppSVar9 = (this->super_ParticleBelief).particles_.
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppSVar11 = (this->super_ParticleBelief).particles_.
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      lVar12 = (long)ppSVar11 - (long)ppSVar9;
      uVar14 = uVar14 + 1;
      ppSVar6 = local_78._M_impl.super__Vector_impl_data._M_start;
      ppSVar10 = local_78._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar13 != lVar12);
    if (lVar13 == lVar12) {
      iVar5 = logging::level();
      uVar3 = local_88._0_4_;
      if ((0 < iVar5) && (iVar5 = logging::level(), 2 < iVar5)) {
        plVar7 = logging::stream(3);
        poVar8 = std::operator<<(&plVar7->super_ostream,"[POMDPXBelief::Update] ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
        poVar8 = std::operator<<(poVar8," iterations for normal simulations");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      break;
    }
    iVar5 = local_88._0_4_ + 1;
  }
  ppSVar6 = (this->super_ParticleBelief).particles_.
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar10 = (this->super_ParticleBelief).particles_.
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if ((long)local_78._M_impl.super__Vector_impl_data._M_finish -
      (long)local_78._M_impl.super__Vector_impl_data._M_start != (long)ppSVar10 - (long)ppSVar6) {
    uVar14 = 0;
    ppSVar9 = local_78._M_impl.super__Vector_impl_data._M_start;
    ppSVar11 = local_78._M_impl.super__Vector_impl_data._M_finish;
    while ((int)uVar14 <= this->max_iter_) {
      local_88._0_8_ = uVar14;
      uVar14 = 0;
      do {
        lVar12 = (long)ppSVar10 - (long)ppSVar6;
        if ((ulong)(lVar12 >> 3) <= uVar14) {
          lVar13 = (long)ppSVar11 - (long)ppSVar9;
          break;
        }
        iVar5 = (*(this->model_->super_MDP)._vptr_MDP[0x1a])(this->model_,ppSVar6[uVar14]);
        pPVar1 = this->model_;
        local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar5)
        ;
        dVar15 = Random::NextDouble((Random *)&Random::RANDOM);
        bVar4 = POMDPX::NoisyStep(pPVar1,(State *)CONCAT44(extraout_var_00,iVar5),dVar15,action);
        (*(this->model_->super_MDP)._vptr_MDP[0xc])
                  (this->model_,obs,local_a0._M_impl.super__Vector_impl_data._M_start,action);
        dVar15 = 1e-06;
        if (local_88._0_4_ != this->max_iter_) {
          dVar15 = extraout_XMM0_Qa_00;
        }
        dVar15 = (double)(~-(ulong)(extraout_XMM0_Qa_00 < 1e-06) & (ulong)extraout_XMM0_Qa_00 |
                         (ulong)dVar15 & -(ulong)(extraout_XMM0_Qa_00 < 1e-06));
        if (bVar4 || dVar15 == 0.0) {
          (*(this->model_->super_MDP)._vptr_MDP[0x1b])
                    (this->model_,local_a0._M_impl.super__Vector_impl_data._M_start);
        }
        else {
          *(double *)((long)local_a0._M_impl.super__Vector_impl_data._M_start + 0x18) =
               dVar15 * *(double *)((long)local_a0._M_impl.super__Vector_impl_data._M_start + 0x18);
          std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                    ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_78,
                     (value_type *)&local_a0);
        }
        lVar13 = (long)local_78._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_78._M_impl.super__Vector_impl_data._M_start;
        ppSVar6 = (this->super_ParticleBelief).particles_.
                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppSVar10 = (this->super_ParticleBelief).particles_.
                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        lVar12 = (long)ppSVar10 - (long)ppSVar6;
        uVar14 = uVar14 + 1;
        ppSVar9 = local_78._M_impl.super__Vector_impl_data._M_start;
        ppSVar11 = local_78._M_impl.super__Vector_impl_data._M_finish;
      } while (lVar13 != lVar12);
      if (lVar13 == lVar12) {
        iVar5 = logging::level();
        auVar17 = local_88;
        if ((0 < iVar5) && (iVar5 = logging::level(), 2 < iVar5)) {
          plVar7 = logging::stream(3);
          poVar8 = std::operator<<(&plVar7->super_ostream,"[POMDPXBelief::Update] ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,auVar17._0_4_);
          poVar8 = std::operator<<(poVar8," iterations for noisy simulations");
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        break;
      }
      uVar14 = (ulong)(local_88._0_4_ + 1);
    }
  }
  this_00 = local_60;
  for (uVar14 = 0;
      ppSVar6 = (this->super_ParticleBelief).particles_.
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar14 < (ulong)((long)(this->super_ParticleBelief).particles_.
                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar6 >> 3);
      uVar14 = uVar14 + 1) {
    (*(this->model_->super_MDP)._vptr_MDP[0x1b])(this->model_,ppSVar6[uVar14]);
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
            (this_00,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_78);
  dVar15 = State::Weight(this_00);
  ppSVar6 = (this->super_ParticleBelief).particles_.
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar10 = (this->super_ParticleBelief).particles_.
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  dVar16 = 0.0;
  for (lVar12 = 0; (long)ppSVar10 - (long)ppSVar6 >> 3 != lVar12; lVar12 = lVar12 + 1) {
    pSVar2 = ppSVar6[lVar12];
    dVar18 = pSVar2->weight / dVar15;
    pSVar2->weight = dVar18;
    dVar16 = dVar16 + dVar18 * dVar18;
  }
  auVar19._8_8_ = (double)(this->super_ParticleBelief).num_particles_;
  auVar19._0_8_ = 0x3ff0000000000000;
  auVar17._8_8_ = 0x4034000000000000;
  auVar17._0_8_ = dVar16;
  local_88 = divpd(auVar19,auVar17);
  if (local_88._0_8_ < local_88._8_8_) {
    iVar5 = logging::level();
    if ((0 < iVar5) && (iVar5 = logging::level(), 2 < iVar5)) {
      plVar7 = logging::stream(3);
      poVar8 = std::operator<<(&plVar7->super_ostream,"[POMDPXBelief::Update] Resampling ");
      poVar8 = (ostream *)
               std::ostream::operator<<(poVar8,(this->super_ParticleBelief).num_particles_);
      std::operator<<(poVar8," as effective number of particles = ");
      poVar8 = std::ostream::_M_insert<double>((double)local_88._0_8_);
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    iVar5 = (this->super_ParticleBelief).num_particles_;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_58,this_00);
    model = &this->model_->super_DSPOMDP;
    if (this->model_ == (POMDPX *)0x0) {
      model = (DSPOMDP *)0x0;
    }
    ParticleBelief::Sample
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_a0,iVar5,
               (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_58,model);
    std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_58);
    for (uVar14 = 0;
        ppSVar6 = (this->super_ParticleBelief).particles_.
                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar14 < (ulong)((long)(this->super_ParticleBelief).particles_.
                               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar6 >> 3);
        uVar14 = uVar14 + 1) {
      (*(this->model_->super_MDP)._vptr_MDP[0x1b])(this->model_,ppSVar6[uVar14]);
    }
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
              (this_00,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_a0);
    std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_a0);
  }
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_78);
  return;
}

Assistant:

void Update(ACT_TYPE action, OBS_TYPE obs) {
		history_.Add(action, obs);

		vector<State*> updated;
		double reward;
		OBS_TYPE o;

		// Update particles by looping through the particles for multiple iterations
		for (int i = 0; i < max_iter_; i++) {
			for (int j = 0; j < particles_.size(); j++) {
				State* particle = particles_[j];
				State* copy = model_->Copy(particle);

				bool terminal = model_->Step(*copy, Random::RANDOM.NextDouble(),
					action, reward, o);
				double prob = model_->ObsProb(obs, *copy, action);

				if (!terminal && prob) { // Terminal state is not required to be explicitly represented and may not have any observation
					copy->weight *= prob;
					updated.push_back(copy);
				} else {
					model_->Free(copy);
				}

				if (updated.size() == particles_.size())
					break;
			}
			if (updated.size() == particles_.size()) {
				logi << "[POMDPXBelief::Update] " << i
					<< " iterations for normal simulations" << endl;
				break;
			}
		}

		// Perform at most max_iter_ noisy iterations to generate particles, or keep
		// inconsistent particles after that
		if (updated.size() != particles_.size()) {
			for (int i = 0; i < max_iter_ + 1; i++) {
				for (int j = 0; j < particles_.size(); j++) {
					State* particle = particles_[j];
					State* copy = model_->Copy(particle);

					bool terminal = model_->NoisyStep(*copy,
						Random::RANDOM.NextDouble(), action);
					double prob = model_->ObsProb(obs, *copy, action);

					if (i == max_iter_ && prob < 1E-6) // NOTE: never kill a particle at the last iteration
						prob = 1E-6;

					if (!terminal && prob) {
						copy->weight *= prob;
						updated.push_back(copy);
					} else {
						model_->Free(copy);
					}

					if (updated.size() == particles_.size())
						break;
				}
				if (updated.size() == particles_.size()) {
					logi << "[POMDPXBelief::Update] " << i
						<< " iterations for noisy simulations" << endl;
					break;
				}
			}
		}

		for (int i = 0; i < particles_.size(); i++)
			model_->Free(particles_[i]);

		particles_ = updated;

		double total_weight = State::Weight(particles_);
		double weight_square_sum = 0;
		for (int i = 0; i < particles_.size(); i++) {
			State* particle = particles_[i];
			particle->weight /= total_weight;
			weight_square_sum += particle->weight * particle->weight;
		}

		// Resample if the effective number of particles is "small"
		double num_effective_particles = 1.0 / weight_square_sum;
		if (num_effective_particles < num_particles_ / 20.0) { // NOTE: small particles may be removed...
			logi << "[POMDPXBelief::Update] Resampling " << num_particles_
				<< " as effective number of particles = "
				<< num_effective_particles << endl;
			vector<State*> new_belief = ParticleBelief::Sample(num_particles_,
				particles_, model_);
			for (int i = 0; i < particles_.size(); i++)
				model_->Free(particles_[i]);

			particles_ = new_belief;
		}
	}